

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ExportDirWrapper::getLibraryName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  bool bVar1;
  char *inp;
  
  inp = _getLibraryName(this);
  if (inp == (char *)0x0) {
    inp = (char *)0x0;
  }
  else {
    bVar1 = pe_util::isStrLonger(inp,100);
    if (bVar1) {
      inp = "<invalid>";
    }
  }
  QString::QString(__return_storage_ptr__,inp);
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getLibraryName()
{
    char *name = this->_getLibraryName();
    if (!name) return name;

    if (pe_util::isStrLonger(name, 100)) {
        return INVALID_NAME;
    }
    return QString(name);
}